

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void char_from_room(CHAR_DATA *ch)

{
  ROOM_INDEX_DATA *room;
  AREA_DATA_conflict *pAVar1;
  string_view fmt;
  bool bVar2;
  int *piVar3;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  CHAR_DATA *prev;
  char *in_stack_00000028;
  AFFECT_DATA *aaf;
  bool other;
  CHAR_DATA *mob;
  OBJ_DATA *obj;
  ROOM_AFFECT_DATA *af;
  ROOM_INDEX_DATA *prev_room;
  CHAR_DATA *in_stack_ffffffffffffff98;
  ulong uVar5;
  undefined8 in_stack_ffffffffffffffa0;
  OBJ_DATA *in_stack_ffffffffffffffa8;
  CHAR_DATA *pCVar6;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  CLogger *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  AFFECT_DATA *pAVar7;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar8;
  ROOM_AFFECT_DATA *in_stack_ffffffffffffffd8;
  ROOM_INDEX_DATA *room_00;
  ROOM_AFFECT_DATA *local_18;
  
  room = in_RDI->in_room;
  bVar8 = 0;
  if (in_RDI->in_room == (ROOM_INDEX_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (char *)in_stack_ffffffffffffffa8);
    fmt._M_str._0_7_ = in_stack_ffffffffffffffd0;
    fmt._M_len = in_stack_ffffffffffffffc8;
    fmt._M_str._7_1_ = bVar8;
    CLogger::Debug<>(in_stack_ffffffffffffffc0,fmt);
  }
  else {
    bVar2 = is_npc(in_stack_ffffffffffffff98);
    if (!bVar2) {
      pAVar1 = in_RDI->in_room->area;
      pAVar1->nplayer = pAVar1->nplayer + -1;
    }
    for (room_00 = (ROOM_INDEX_DATA *)in_RDI->carrying; room_00 != (ROOM_INDEX_DATA *)0x0;
        room_00 = room_00->next_room) {
      if ((*(short *)(room_00->tracks + 0x13) != -1) &&
         (((*(short *)(room_00->tracks + 6) == 1 ||
           (bVar2 = is_obj_stat(in_stack_ffffffffffffffa8,
                                (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20)), bVar2)) &&
          (in_RDI->in_room != (ROOM_INDEX_DATA *)0x0)))) {
        piVar3 = std::max<int>((int *)&stack0xffffffffffffffb4,(int *)&stack0xffffffffffffffb0);
        in_RDI->in_room->light = (short)*piVar3;
      }
    }
    uVar5 = in_RDI->progtypes[0];
    _Var4 = std::pow<int,int>(0,0x5f861b);
    if ((uVar5 & (long)_Var4) != 0) {
      for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0;
          pCVar6 = pCVar6->next_in_room) {
        if (pCVar6 != in_RDI) {
          uVar5 = pCVar6->progtypes[0];
          _Var4 = std::pow<int,int>(0,0x5f867a);
          if ((uVar5 & (long)_Var4) != 0) {
            bVar8 = 1;
          }
        }
      }
      if ((bVar8 & 1) == 0) {
        in_RDI->in_room->move_progs = false;
      }
      in_stack_ffffffffffffffd8 = (ROOM_AFFECT_DATA *)0x0;
    }
    if (in_RDI == in_RDI->in_room->people) {
      in_RDI->in_room->people = in_RDI->next_in_room;
    }
    else {
      for (pCVar6 = in_RDI->in_room->people; pCVar6 != (CHAR_DATA *)0x0;
          pCVar6 = pCVar6->next_in_room) {
        if (pCVar6->next_in_room == in_RDI) {
          pCVar6->next_in_room = in_RDI->next_in_room;
          break;
        }
      }
    }
    in_RDI->in_room = (ROOM_INDEX_DATA *)0x0;
    in_RDI->next_in_room = (CHAR_DATA *)0x0;
    in_RDI->on = (OBJ_DATA *)0x0;
    bVar2 = is_affected_room(room,(int)gsn_gravity_well);
    if (bVar2) {
      for (local_18 = room->affected;
          (local_18 != (ROOM_AFFECT_DATA *)0x0 && (local_18->type != gsn_gravity_well));
          local_18 = local_18->next) {
      }
      if (in_RDI == local_18->owner) {
        gravity_well_explode(room_00,in_stack_ffffffffffffffd8);
      }
    }
    bVar2 = is_affected(in_RDI,(int)gsn_pull);
    if ((bVar2) ||
       ((bVar2 = check_entwine(in_RDI,1), !bVar2 && (bVar2 = check_entwine(in_RDI,2), !bVar2)))) {
      bVar2 = is_affected(in_RDI,(int)gsn_pull);
      if ((!bVar2) && (bVar2 = check_entwine(in_RDI,0), bVar2)) {
        do_uncoil((CHAR_DATA *)aaf,in_stack_00000028);
      }
    }
    else {
      for (pAVar7 = in_RDI->affected;
          (pAVar7 != (AFFECT_DATA *)0x0 &&
          ((pAVar7->type != gsn_entwine || ((pAVar7->modifier != 1 && (pAVar7->location != 2))))));
          pAVar7 = pAVar7->next) {
      }
      do_uncoil((CHAR_DATA *)aaf,in_stack_00000028);
    }
  }
  return;
}

Assistant:

void char_from_room(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *prev_room = ch->in_room;
	ROOM_AFFECT_DATA *af;
	OBJ_DATA *obj;
	CHAR_DATA *mob;
	bool other= false;
	AFFECT_DATA *aaf;

	if (ch->in_room == nullptr)
	{
		RS.Logger.Debug("Char_from_room: nullptr.");
		return;
	}

	if (!is_npc(ch))
		--ch->in_room->area->nplayer;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE)
		{
			if ((obj->item_type == ITEM_LIGHT || is_obj_stat(obj, ITEM_GLOW)) && ch->in_room)
				ch->in_room->light = std::max(0, ch->in_room->light - 3);
		}
	}

	if (IS_SET(ch->progtypes, MPROG_MOVE))
	{
		for (mob = ch->in_room->people; mob; mob = mob->next_in_room)
		{
			if (mob != ch && IS_SET(mob->progtypes, MPROG_MOVE))
				other = true;
		}

		if (!other)
			ch->in_room->move_progs = false;
	}

	if (ch == ch->in_room->people)
	{
		ch->in_room->people = ch->next_in_room;
	}
	else
	{
		CHAR_DATA *prev;

		for (prev = ch->in_room->people; prev; prev = prev->next_in_room)
		{
			if (prev->next_in_room == ch)
			{
				prev->next_in_room = ch->next_in_room;
				break;
			}
		}
		/*
		if ( prev == nullptr )
			RS.Logger.Warn("Char_from_room: ch not found.");
		*/
	}

	ch->in_room = nullptr;
	ch->next_in_room = nullptr;
	ch->on = nullptr; /* sanity check! */

	if (is_affected_room(prev_room, gsn_gravity_well))
	{
		for (af = prev_room->affected; af != nullptr; af = af->next)
		{
			if (af->type == gsn_gravity_well)
				break;
		}

		if (ch == af->owner)
			gravity_well_explode(prev_room, af);
	}
	if (!is_affected(ch, gsn_pull) && (check_entwine(ch, 1) || check_entwine(ch, 2)))
	{
		for (aaf = ch->affected; aaf != nullptr; aaf = aaf->next)
		{
			if (aaf->type == gsn_entwine && (aaf->modifier == 1 || aaf->location == APPLY_DEX))
				break;
		}

		do_uncoil(aaf->owner, "automagic");
	}
	else if (!is_affected(ch, gsn_pull) && check_entwine(ch, 0))
	{
		do_uncoil(ch, "automagic");
	}
}